

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

string * __thiscall nuraft::raft_server::get_aux_abi_cxx11_(raft_server *this,int32 srv_id)

{
  bool bVar1;
  element_type *this_00;
  string *psVar2;
  string *in_RDI;
  ptr<srv_config> s_conf;
  ptr<cluster_config> c_conf;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  __shared_ptr local_38 [12];
  int in_stack_ffffffffffffffd4;
  cluster_config *in_stack_ffffffffffffffd8;
  
  get_config((raft_server *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2b4fcd);
  cluster_config::get_server(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2b501c);
    psVar2 = srv_config::get_aux_abi_cxx11_(this_00);
    std::__cxx11::string::string(in_RDI,(string *)psVar2);
  }
  else {
    std::__cxx11::string::string(in_RDI);
  }
  std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x2b5068);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x2b5072);
  return in_RDI;
}

Assistant:

std::string raft_server::get_aux(int32 srv_id) const {
    ptr<cluster_config> c_conf = get_config();
    ptr<srv_config> s_conf = c_conf->get_server(srv_id);
    if (!s_conf) return std::string();

    return s_conf->get_aux();
}